

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

bool __thiscall
Lib::DHMap<Kernel::TermList,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::IteratorBase::
hasNext(IteratorBase *this)

{
  Entry *pEVar1;
  
  pEVar1 = this->_next;
  while ((pEVar1 != this->_last &&
         (((pEVar1->field_0)._infoData & 1U) != 0 ||
          (uint)(pEVar1->field_0)._infoData >> 2 != this->_timestamp))) {
    pEVar1 = pEVar1 + 1;
    this->_next = pEVar1;
  }
  return pEVar1 != this->_last;
}

Assistant:

bool hasNext()
    {
      while (_next != _last) {
	if (_next->_info.timestamp==_timestamp && !_next->_info.deleted) {
	  return true;
	}
	_next++;
      }
      return false;
    }